

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BetweenTests.cpp
# Opt level: O2

void __thiscall IsNotBetweenTests::Run(IsNotBetweenTests *this)

{
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string(local_c8,"Is::Not::Between(5,10)(7) is Not::True",&local_149);
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:44:50)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:44:50)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])(this,local_c8)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::string(local_e8,"Is::Not::Between(5,10)(12) is Not::False",&local_149);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:49:52)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:49:52)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])(this,local_e8)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::string(local_108,"Is::Not::Between(5,10)(3) is Not::False",&local_149);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:54:51)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:54:51)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::string(local_128,"Is::Not::Between is an operand",&local_149);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:59:42)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:59:42)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::string(local_148,"Is::Not::Between has an error message",&local_149);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:64:49)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/BetweenTests.cpp:64:49)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string(local_148);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::Between(5,10)(7) is Not::True", []()
		{
			AssertThat(ut11::Is::Not::Between(5, 10)(7), ut11::Is::Not::True);
		});

		Then("Is::Not::Between(5,10)(12) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::Between(5, 10)(12), ut11::Is::Not::False);
		});

		Then("Is::Not::Between(5,10)(3) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::Between(5, 10)(3), ut11::Is::Not::False);
		});

		Then("Is::Not::Between is an operand", []()
		{
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::Between(5,10)) >::value, ut11::Is::True);
		});

		Then("Is::Not::Between has an error message", []() {
			AssertThat(ut11::Is::Not::Between(5, 10).GetErrorMessage(3), ut11::Is::Not::EqualTo(""));
		});
	}